

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::InputFile::Data::readPixels
          (Data *this,FrameBuffer *frameBuffer,int scanLine1,int scanLine2)

{
  bool bVar1;
  ScanLineInputFile *in_RDI;
  lock_guard<std::mutex> lock_1;
  lock_guard<std::mutex> lock;
  int in_stack_000000d8;
  int in_stack_000000dc;
  Data *in_stack_000000e0;
  FrameBuffer *in_stack_00000158;
  Data *in_stack_00000160;
  FrameBuffer *in_stack_000001e8;
  CompositeDeepScanLine *in_stack_000001f0;
  int in_stack_000002d8;
  int in_stack_000002dc;
  CompositeDeepScanLine *in_stack_000002e0;
  FrameBuffer *in_stack_ffffffffffffffb8;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
                      *)0xa2c9a9);
  if (bVar1) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffffb8);
    std::
    unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
    ::operator->((unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
                  *)0xa2c9cc);
    CompositeDeepScanLine::setFrameBuffer(in_stack_000001f0,in_stack_000001e8);
    std::
    unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
    ::operator->((unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
                  *)0xa2c9e9);
    CompositeDeepScanLine::readPixels(in_stack_000002e0,in_stack_000002dc,in_stack_000002d8);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xa2ca05);
  }
  else if (*(int *)((long)&in_RDI[1]._data.
                           super___shared_ptr<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 4) == 1) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffffb8);
    lockedSetFrameBuffer(in_stack_00000160,in_stack_00000158);
    bufferedReadPixels(in_stack_000000e0,in_stack_000000dc,in_stack_000000d8);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xa2ca70);
  }
  else {
    std::unique_ptr<Imf_3_3::ScanLineInputFile,_std::default_delete<Imf_3_3::ScanLineInputFile>_>::
    operator->((unique_ptr<Imf_3_3::ScanLineInputFile,_std::default_delete<Imf_3_3::ScanLineInputFile>_>
                *)0xa2ca9a);
    ScanLineInputFile::readPixels(in_RDI,in_stack_ffffffffffffffb8,0,0xa2caaf);
  }
  return;
}

Assistant:

void
InputFile::Data::readPixels (
    const FrameBuffer& frameBuffer, int scanLine1, int scanLine2)
{
    if (_compositor)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (_mx);
#endif
        _compositor->setFrameBuffer (frameBuffer);
        _compositor->readPixels (scanLine1, scanLine2);
    }
    else if (_storage == EXR_STORAGE_TILED)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (_mx);
#endif

        lockedSetFrameBuffer (frameBuffer);
        bufferedReadPixels (scanLine1, scanLine2);
    }
    else { _sFile->readPixels (frameBuffer, scanLine1, scanLine2); }
}